

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

void GenerateMixingConstants(void)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint v;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  int primefail;
  uint8_t match [256];
  int local_150;
  uint local_14c;
  uint local_148;
  char local_138 [264];
  
  local_150 = 0;
  uVar12 = 0;
  local_14c = 0;
  uVar9 = 0;
  local_148 = 0;
  uVar16 = 0;
  uVar13 = 0x97b2ebee;
  uVar3 = 0x5fa2f65b;
  uVar7 = 0xeb8f1b15;
  uVar6 = 0x784bf0ba;
  do {
    v = uVar7;
    uVar7 = uVar13;
    uVar4 = popcount(v);
    uVar14 = (ulong)v;
    if (uVar4 < 0x10) {
      uVar14 = 0;
    }
    uVar5 = popcount((uint32_t)uVar14);
    local_148 = local_148 + (0x10 < uVar5) + (uint)(uVar4 < 0x10);
    if (0x10 >= uVar5 && (uint32_t)uVar14 != 0) {
      uVar13 = 0;
      do {
        bVar2 = (byte)uVar13 & 0x1f;
        uVar15 = ((uint)uVar14 << bVar2 | (uint)uVar14 >> 0x20 - bVar2) & 0xff;
        uVar4 = popcount(uVar15);
        if (uVar4 < 3) {
LAB_0016c701:
          uVar16 = uVar16 + 1;
          uVar14 = 0;
          bVar17 = false;
        }
        else {
          uVar4 = popcount(uVar15);
          bVar17 = true;
          if (5 < uVar4) goto LAB_0016c701;
        }
      } while ((bVar17) && (bVar17 = uVar13 < 0x1f, uVar13 = uVar13 + 1, bVar17));
      uVar13 = (uint)uVar14;
      if (uVar13 != 0) {
        local_138[0xc0] = '\0';
        local_138[0xc1] = '\0';
        local_138[0xc2] = '\0';
        local_138[0xc3] = '\0';
        local_138[0xc4] = '\0';
        local_138[0xc5] = '\0';
        local_138[0xc6] = '\0';
        local_138[199] = '\0';
        local_138[200] = '\0';
        local_138[0xc9] = '\0';
        local_138[0xca] = '\0';
        local_138[0xcb] = '\0';
        local_138[0xcc] = '\0';
        local_138[0xcd] = '\0';
        local_138[0xce] = '\0';
        local_138[0xcf] = '\0';
        local_138[0xd0] = '\0';
        local_138[0xd1] = '\0';
        local_138[0xd2] = '\0';
        local_138[0xd3] = '\0';
        local_138[0xd4] = '\0';
        local_138[0xd5] = '\0';
        local_138[0xd6] = '\0';
        local_138[0xd7] = '\0';
        local_138[0xd8] = '\0';
        local_138[0xd9] = '\0';
        local_138[0xda] = '\0';
        local_138[0xdb] = '\0';
        local_138[0xdc] = '\0';
        local_138[0xdd] = '\0';
        local_138[0xde] = '\0';
        local_138[0xdf] = '\0';
        local_138[0xe0] = '\0';
        local_138[0xe1] = '\0';
        local_138[0xe2] = '\0';
        local_138[0xe3] = '\0';
        local_138[0xe4] = '\0';
        local_138[0xe5] = '\0';
        local_138[0xe6] = '\0';
        local_138[0xe7] = '\0';
        local_138[0xe8] = '\0';
        local_138[0xe9] = '\0';
        local_138[0xea] = '\0';
        local_138[0xeb] = '\0';
        local_138[0xec] = '\0';
        local_138[0xed] = '\0';
        local_138[0xee] = '\0';
        local_138[0xef] = '\0';
        local_138[0xf0] = '\0';
        local_138[0xf1] = '\0';
        local_138[0xf2] = '\0';
        local_138[0xf3] = '\0';
        local_138[0xf4] = '\0';
        local_138[0xf5] = '\0';
        local_138[0xf6] = '\0';
        local_138[0xf7] = '\0';
        local_138[0xf8] = '\0';
        local_138[0xf9] = '\0';
        local_138[0xfa] = '\0';
        local_138[0xfb] = '\0';
        local_138[0xfc] = '\0';
        local_138[0xfd] = '\0';
        local_138[0xfe] = '\0';
        local_138[0xff] = '\0';
        local_138[0x80] = '\0';
        local_138[0x81] = '\0';
        local_138[0x82] = '\0';
        local_138[0x83] = '\0';
        local_138[0x84] = '\0';
        local_138[0x85] = '\0';
        local_138[0x86] = '\0';
        local_138[0x87] = '\0';
        local_138[0x88] = '\0';
        local_138[0x89] = '\0';
        local_138[0x8a] = '\0';
        local_138[0x8b] = '\0';
        local_138[0x8c] = '\0';
        local_138[0x8d] = '\0';
        local_138[0x8e] = '\0';
        local_138[0x8f] = '\0';
        local_138[0x90] = '\0';
        local_138[0x91] = '\0';
        local_138[0x92] = '\0';
        local_138[0x93] = '\0';
        local_138[0x94] = '\0';
        local_138[0x95] = '\0';
        local_138[0x96] = '\0';
        local_138[0x97] = '\0';
        local_138[0x98] = '\0';
        local_138[0x99] = '\0';
        local_138[0x9a] = '\0';
        local_138[0x9b] = '\0';
        local_138[0x9c] = '\0';
        local_138[0x9d] = '\0';
        local_138[0x9e] = '\0';
        local_138[0x9f] = '\0';
        local_138[0xa0] = '\0';
        local_138[0xa1] = '\0';
        local_138[0xa2] = '\0';
        local_138[0xa3] = '\0';
        local_138[0xa4] = '\0';
        local_138[0xa5] = '\0';
        local_138[0xa6] = '\0';
        local_138[0xa7] = '\0';
        local_138[0xa8] = '\0';
        local_138[0xa9] = '\0';
        local_138[0xaa] = '\0';
        local_138[0xab] = '\0';
        local_138[0xac] = '\0';
        local_138[0xad] = '\0';
        local_138[0xae] = '\0';
        local_138[0xaf] = '\0';
        local_138[0xb0] = '\0';
        local_138[0xb1] = '\0';
        local_138[0xb2] = '\0';
        local_138[0xb3] = '\0';
        local_138[0xb4] = '\0';
        local_138[0xb5] = '\0';
        local_138[0xb6] = '\0';
        local_138[0xb7] = '\0';
        local_138[0xb8] = '\0';
        local_138[0xb9] = '\0';
        local_138[0xba] = '\0';
        local_138[0xbb] = '\0';
        local_138[0xbc] = '\0';
        local_138[0xbd] = '\0';
        local_138[0xbe] = '\0';
        local_138[0xbf] = '\0';
        local_138[0x40] = '\0';
        local_138[0x41] = '\0';
        local_138[0x42] = '\0';
        local_138[0x43] = '\0';
        local_138[0x44] = '\0';
        local_138[0x45] = '\0';
        local_138[0x46] = '\0';
        local_138[0x47] = '\0';
        local_138[0x48] = '\0';
        local_138[0x49] = '\0';
        local_138[0x4a] = '\0';
        local_138[0x4b] = '\0';
        local_138[0x4c] = '\0';
        local_138[0x4d] = '\0';
        local_138[0x4e] = '\0';
        local_138[0x4f] = '\0';
        local_138[0x50] = '\0';
        local_138[0x51] = '\0';
        local_138[0x52] = '\0';
        local_138[0x53] = '\0';
        local_138[0x54] = '\0';
        local_138[0x55] = '\0';
        local_138[0x56] = '\0';
        local_138[0x57] = '\0';
        local_138[0x58] = '\0';
        local_138[0x59] = '\0';
        local_138[0x5a] = '\0';
        local_138[0x5b] = '\0';
        local_138[0x5c] = '\0';
        local_138[0x5d] = '\0';
        local_138[0x5e] = '\0';
        local_138[0x5f] = '\0';
        local_138[0x60] = '\0';
        local_138[0x61] = '\0';
        local_138[0x62] = '\0';
        local_138[99] = '\0';
        local_138[100] = '\0';
        local_138[0x65] = '\0';
        local_138[0x66] = '\0';
        local_138[0x67] = '\0';
        local_138[0x68] = '\0';
        local_138[0x69] = '\0';
        local_138[0x6a] = '\0';
        local_138[0x6b] = '\0';
        local_138[0x6c] = '\0';
        local_138[0x6d] = '\0';
        local_138[0x6e] = '\0';
        local_138[0x6f] = '\0';
        local_138[0x70] = '\0';
        local_138[0x71] = '\0';
        local_138[0x72] = '\0';
        local_138[0x73] = '\0';
        local_138[0x74] = '\0';
        local_138[0x75] = '\0';
        local_138[0x76] = '\0';
        local_138[0x77] = '\0';
        local_138[0x78] = '\0';
        local_138[0x79] = '\0';
        local_138[0x7a] = '\0';
        local_138[0x7b] = '\0';
        local_138[0x7c] = '\0';
        local_138[0x7d] = '\0';
        local_138[0x7e] = '\0';
        local_138[0x7f] = '\0';
        local_138[0] = '\0';
        local_138[1] = '\0';
        local_138[2] = '\0';
        local_138[3] = '\0';
        local_138[4] = '\0';
        local_138[5] = '\0';
        local_138[6] = '\0';
        local_138[7] = '\0';
        local_138[8] = '\0';
        local_138[9] = '\0';
        local_138[10] = '\0';
        local_138[0xb] = '\0';
        local_138[0xc] = '\0';
        local_138[0xd] = '\0';
        local_138[0xe] = '\0';
        local_138[0xf] = '\0';
        local_138[0x10] = '\0';
        local_138[0x11] = '\0';
        local_138[0x12] = '\0';
        local_138[0x13] = '\0';
        local_138[0x14] = '\0';
        local_138[0x15] = '\0';
        local_138[0x16] = '\0';
        local_138[0x17] = '\0';
        local_138[0x18] = '\0';
        local_138[0x19] = '\0';
        local_138[0x1a] = '\0';
        local_138[0x1b] = '\0';
        local_138[0x1c] = '\0';
        local_138[0x1d] = '\0';
        local_138[0x1e] = '\0';
        local_138[0x1f] = '\0';
        local_138[0x20] = '\0';
        local_138[0x21] = '\0';
        local_138[0x22] = '\0';
        local_138[0x23] = '\0';
        local_138[0x24] = '\0';
        local_138[0x25] = '\0';
        local_138[0x26] = '\0';
        local_138[0x27] = '\0';
        local_138[0x28] = '\0';
        local_138[0x29] = '\0';
        local_138[0x2a] = '\0';
        local_138[0x2b] = '\0';
        local_138[0x2c] = '\0';
        local_138[0x2d] = '\0';
        local_138[0x2e] = '\0';
        local_138[0x2f] = '\0';
        local_138[0x30] = '\0';
        local_138[0x31] = '\0';
        local_138[0x32] = '\0';
        local_138[0x33] = '\0';
        local_138[0x34] = '\0';
        local_138[0x35] = '\0';
        local_138[0x36] = '\0';
        local_138[0x37] = '\0';
        local_138[0x38] = '\0';
        local_138[0x39] = '\0';
        local_138[0x3a] = '\0';
        local_138[0x3b] = '\0';
        local_138[0x3c] = '\0';
        local_138[0x3d] = '\0';
        local_138[0x3e] = '\0';
        local_138[0x3f] = '\0';
        uVar15 = 0;
        do {
          bVar2 = (byte)uVar15 & 0x1f;
          uVar8 = (uVar13 << bVar2 | uVar13 >> 0x20 - bVar2) & 0xff;
          if (local_138[uVar8] != '\0') {
            uVar9 = uVar9 + 1;
            uVar14 = 0;
            break;
          }
          local_138[uVar8] = '\x01';
          bVar17 = uVar15 < 0x1f;
          uVar15 = uVar15 + 1;
        } while (bVar17);
        uVar13 = (uint)uVar14;
        if (uVar13 != 0) {
          lVar10 = 0;
          do {
            bVar17 = false;
            if ((int)(uVar14 % (ulong)*(uint *)((long)&DAT_0018b960 + lVar10)) == 0)
            goto LAB_0016c7e4;
            lVar10 = lVar10 + 4;
          } while (lVar10 != 0xd8);
          if (uVar13 * -0xff00ff < 0xff0100) {
            bVar17 = false;
          }
          else {
            uVar11 = 0x103;
            do {
              bVar17 = 0xfffd < (int)uVar11 - 2U;
              if (bVar17) break;
              uVar1 = uVar14 % uVar11;
              uVar11 = (ulong)((int)uVar11 + 2);
            } while ((int)uVar1 != 0);
          }
LAB_0016c7e4:
          local_14c = local_14c + (bVar17 ^ 1U);
          if ((bVar17 ^ 1U) == 0) {
            printf("0x%08x : 0x%08x\n",uVar14,(ulong)~uVar13);
            local_150 = local_150 + 1;
          }
        }
      }
    }
    uVar12 = uVar12 + 1;
    uVar6 = uVar6 << 0xb ^ uVar6;
    uVar13 = uVar3;
    uVar3 = uVar6 >> 8 ^ uVar3 >> 0x13 ^ uVar3 ^ uVar6;
    uVar6 = v;
    if (99 < local_150) {
      printf("%d %d %d %d %d %d\n",(ulong)uVar12,(ulong)local_148,(ulong)uVar16,(ulong)uVar9,
             (ulong)local_14c,local_150);
      return;
    }
  } while( true );
}

Assistant:

void GenerateMixingConstants ( void )
{
  Rand r(8350147);

  int count = 0;

  int trials = 0;
  int bitfail = 0;
  int popfail = 0;
  int matchfail = 0;
  int primefail = 0;

  //for(uint32_t x = 1; x; x++)
  while(count < 100)
  {
    //if(x % 100000000 == 0) printf(".");

    trials++;
    uint32_t b = r.rand_u32();
    //uint32_t b = x;

    //----------
    // must have between 14 and 18 set bits

    if(popcount(b) < 16) { b = 0; popfail++; }
    if(popcount(b) > 16) { b = 0; popfail++; }

    if(b == 0) continue;

    //----------
    // must have 3-5 bits set per 8-bit window

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;

      if(popcount(c) < 3) { b = 0; bitfail++; break; }
      if(popcount(c) > 5) { b = 0; bitfail++; break; }
    }

    if(b == 0) continue;

    //----------
    // all 8-bit windows must be different

    uint8_t match[256];

    memset(match,0,256);

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;
      
      if(match[c]) { b = 0; matchfail++; break; }

      match[c] = 1;
    }

    if(b == 0) continue;

    //----------
    // must be prime

    if(!isprime(b))
    {
      b = 0;
      primefail++;
    }

    if(b == 0) continue;

    //----------

    if(b)
    {
      printf("0x%08x : 0x%08x\n",b,~b);
      count++;
    }
  }

  printf("%d %d %d %d %d %d\n",trials,popfail,bitfail,matchfail,primefail,count);
}